

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

bool QMetaType::canView(QMetaType fromType,QMetaType toType)

{
  bool bVar1;
  uint uVar2;
  __atomic_base<int> _Var3;
  __atomic_base<int> _Var4;
  int iVar5;
  InterfaceType *this;
  function<bool_(void_*,_void_*)> *pfVar6;
  InterfaceType *pIVar7;
  ulong uVar8;
  
  this = fromType.d_ptr;
  while( true ) {
    if (fromType.d_ptr == (QMetaTypeInterface *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar2 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
      uVar8 = (ulong)uVar2;
      if (uVar2 == 0) {
        this = fromType.d_ptr;
        uVar2 = registerHelper(fromType.d_ptr);
        uVar8 = (ulong)uVar2;
      }
    }
    if (toType.d_ptr == (QMetaTypeInterface *)0x0) {
      return false;
    }
    _Var3._M_i = ((toType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (_Var3._M_i == 0) {
      this = toType.d_ptr;
      _Var3._M_i = registerHelper(toType.d_ptr);
    }
    if ((int)uVar8 == 0) {
      return false;
    }
    if (_Var3._M_i == 0) {
      return false;
    }
    this = (InterfaceType *)
           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesMutableViewRegistry>_>
           ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesMutableViewRegistry>_>
                         *)this);
    pfVar6 = QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>::
             function((QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>
                       *)this,(pair<int,_int>)(uVar8 | (ulong)(uint)_Var3._M_i << 0x20));
    if (pfVar6 != (function<bool_(void_*,_void_*)> *)0x0) break;
    _Var4._M_i = (__int_type_conflict)
                 QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::metaType.typeId;
    if ((__atomic_base<int>)
        QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::metaType.typeId._q_value.
        super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
      pIVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::metaType;
      _Var4._M_i = registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::
                                   metaType);
      this = pIVar7;
    }
    if (_Var3._M_i == _Var4._M_i) {
      toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaSequence>_>::metaType;
      if (fromType.d_ptr != (QMetaTypeInterface *)0x0) {
        iVar5 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
        if (iVar5 == 0) {
          this = fromType.d_ptr;
          iVar5 = registerHelper(fromType.d_ptr);
        }
        toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaSequence>_>::metaType;
        if ((iVar5 - 9U < 0x29) &&
           (toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaSequence>_>::
                            metaType, (0x1000000000fU >> ((ulong)(iVar5 - 9U) & 0x3f) & 1) != 0)) {
          return true;
        }
      }
    }
    else {
      _Var4._M_i = (__int_type_conflict)
                   QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::metaType.typeId.
                   _q_value.super___atomic_base<int>._M_i;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        this = &QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::metaType;
        _Var4._M_i = registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::
                                     metaType);
      }
      if (_Var3._M_i != _Var4._M_i) {
        bVar1 = canConvertMetaObject(fromType,toType);
        return bVar1;
      }
      toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaAssociation>_>::metaType;
      if (fromType.d_ptr != (QMetaTypeInterface *)0x0) {
        iVar5 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
        if (iVar5 == 0) {
          this = fromType.d_ptr;
          iVar5 = registerHelper(fromType.d_ptr);
        }
        if (iVar5 == 8) {
          return true;
        }
        toType.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaAssociation>_>::metaType
        ;
        if (iVar5 == 0x1c) {
          return true;
        }
      }
    }
  }
  return true;
}

Assistant:

bool QMetaType::canView(QMetaType fromType, QMetaType toType)
{
    int fromTypeId = fromType.id();
    int toTypeId = toType.id();

    if (fromTypeId == UnknownType || toTypeId == UnknownType)
        return false;

    const auto f = customTypesMutableViewRegistry()->function({fromTypeId, toTypeId});
    if (f)
        return true;

    if (toTypeId == qMetaTypeId<QSequentialIterable>())
        return canImplicitlyViewAsSequentialIterable(fromType);

    if (toTypeId == qMetaTypeId<QAssociativeIterable>())
        return canImplicitlyViewAsAssociativeIterable(fromType);

    if (canConvertMetaObject(fromType, toType))
        return true;

    return false;
}